

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_gpio_set_multi(uint32_t mask)

{
  if (debug != '\0') {
    printf("bcm2835_peri_write paddr %p, value %08X\n");
    return;
  }
  bcm2835_gpio[7] = mask;
  return;
}

Assistant:

void bcm2835_gpio_set_multi(uint32_t mask)
{
    volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPSET0/4;
    bcm2835_peri_write(paddr, mask);
}